

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.h
# Opt level: O0

void __thiscall crnlib::mipmapped_texture::qdxt_state::qdxt_state(qdxt_state *this,task_pool *tp)

{
  undefined4 *in_RDI;
  task_pool *in_stack_00000008;
  qdxt1 *in_stack_00000010;
  undefined4 *local_50;
  
  *in_RDI = 0;
  qdxt1::qdxt1(in_stack_00000010,in_stack_00000008);
  qdxt5::qdxt5((qdxt5 *)in_stack_00000010,in_stack_00000008);
  qdxt5::qdxt5((qdxt5 *)in_stack_00000010,in_stack_00000008);
  vector<crnlib::dxt_pixel_block>::vector((vector<crnlib::dxt_pixel_block> *)(in_RDI + 0x12c8));
  qdxt1_params::qdxt1_params((qdxt1_params *)0x1765d4);
  local_50 = in_RDI + 0x1458;
  do {
    qdxt5_params::qdxt5_params((qdxt5_params *)0x176604);
    local_50 = local_50 + 0x18c;
  } while (local_50 != in_RDI + 6000);
  return;
}

Assistant:

qdxt_state(task_pool& tp)
        : m_fmt(PIXEL_FMT_INVALID), m_qdxt1(tp), m_qdxt5a(tp), m_qdxt5b(tp) {
    }